

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger_impl.h
# Opt level: O0

void __thiscall
spdlog::async_logger::async_logger<std::shared_ptr<spdlog::sinks::sink>const*>
          (async_logger *this,string *logger_name,shared_ptr<spdlog::sinks::sink> **begin,
          shared_ptr<spdlog::sinks::sink> **end,size_t queue_size,
          async_overflow_policy overflow_policy,function<void_()> *worker_warmup_cb,
          milliseconds *flush_interval_ms,function<void_()> *worker_teardown_cb)

{
  async_overflow_policy overflow_policy_00;
  size_t queue_size_00;
  async_log_helper *this_00;
  function<void_()> local_f0;
  function<void_()> local_d0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b0;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  local_90;
  shared_ptr<spdlog::formatter> local_78 [2];
  string local_58;
  async_overflow_policy local_34;
  size_t sStack_30;
  async_overflow_policy overflow_policy_local;
  size_t queue_size_local;
  shared_ptr<spdlog::sinks::sink> **end_local;
  shared_ptr<spdlog::sinks::sink> **begin_local;
  string *logger_name_local;
  async_logger *this_local;
  
  local_34 = overflow_policy;
  sStack_30 = queue_size;
  queue_size_local = (size_t)end;
  end_local = begin;
  begin_local = (shared_ptr<spdlog::sinks::sink> **)logger_name;
  logger_name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)logger_name);
  spdlog::logger::logger<std::shared_ptr<spdlog::sinks::sink>const*>
            (&this->super_logger,&local_58,end_local,
             (shared_ptr<spdlog::sinks::sink> **)queue_size_local);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__async_logger_002c3950;
  this_00 = (async_log_helper *)operator_new(0x1c8);
  std::shared_ptr<spdlog::formatter>::shared_ptr(local_78,&(this->super_logger)._formatter);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::vector(&local_90,&(this->super_logger)._sinks);
  queue_size_00 = sStack_30;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_b0,&(this->super_logger)._err_handler);
  overflow_policy_00 = local_34;
  std::function<void_()>::function(&local_d0,worker_warmup_cb);
  std::function<void_()>::function(&local_f0,worker_teardown_cb);
  details::async_log_helper::async_log_helper
            (this_00,local_78,&local_90,queue_size_00,&local_b0,overflow_policy_00,&local_d0,
             flush_interval_ms,&local_f0);
  std::
  unique_ptr<spdlog::details::async_log_helper,std::default_delete<spdlog::details::async_log_helper>>
  ::unique_ptr<std::default_delete<spdlog::details::async_log_helper>,void>
            ((unique_ptr<spdlog::details::async_log_helper,std::default_delete<spdlog::details::async_log_helper>>
              *)&this->_async_log_helper,this_00);
  std::function<void_()>::~function(&local_f0);
  std::function<void_()>::~function(&local_d0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b0);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&local_90);
  std::shared_ptr<spdlog::formatter>::~shared_ptr(local_78);
  return;
}

Assistant:

inline spdlog::async_logger::async_logger(const std::string &logger_name, const It &begin, const It &end, size_t queue_size,
    const async_overflow_policy overflow_policy, const std::function<void()> &worker_warmup_cb,
    const std::chrono::milliseconds &flush_interval_ms, const std::function<void()> &worker_teardown_cb)
    : logger(logger_name, begin, end)
    , _async_log_helper(new details::async_log_helper(
          _formatter, _sinks, queue_size, _err_handler, overflow_policy, worker_warmup_cb, flush_interval_ms, worker_teardown_cb))
{
}